

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O0

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::remove_from_select
          (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
           *this,select_case_t *select_case)

{
  select_case_t *next_00;
  select_case_t *next;
  select_case_t *prev;
  select_case_t *c;
  lock_guard<std::mutex> lock;
  select_case_t *select_case_local;
  mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
  *this_local;
  
  lock._M_device = (mutex_type *)select_case;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&c,&this->m_lock);
  next = (select_case_t *)0x0;
  prev = this->m_select_tail;
  do {
    if (prev == (select_case_t *)0x0) {
LAB_00488314:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&c);
      return;
    }
    next_00 = select_case_t::query_next(prev);
    if (prev == (select_case_t *)lock._M_device) {
      if (next == (select_case_t *)0x0) {
        this->m_select_tail = next_00;
      }
      else {
        select_case_t::set_next(next,next_00);
      }
      goto LAB_00488314;
    }
    next = prev;
    prev = next_00;
  } while( true );
}

Assistant:

virtual void
		remove_from_select(
			select_case_t & select_case ) override
			{
				std::lock_guard< std::mutex > lock{ m_lock };

				select_case_t * c = m_select_tail;
				select_case_t * prev = nullptr;
				while( c )
					{
						select_case_t * const next = c->query_next();
						if( c == &select_case )
							{
								if( prev )
									prev->set_next( next );
								else
									m_select_tail = next;

								return;
							}

						prev = c;
						c = next;
					}
			}